

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action.cpp
# Opt level: O1

int __thiscall Order::clone(Order *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  pointer pcVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)operator_new(0x30);
  *puVar2 = &PTR___cxa_pure_virtual_001118a0;
  puVar2[1] = puVar2 + 3;
  pcVar1 = (this->super_BaseAction).errorMsg._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar2 + 1),pcVar1,
             pcVar1 + (this->super_BaseAction).errorMsg._M_string_length);
  *(ActionStatus *)(puVar2 + 5) = (this->super_BaseAction).status;
  *puVar2 = &PTR_act_00111910;
  *(undefined4 *)((long)puVar2 + 0x2c) = *(undefined4 *)&(this->super_BaseAction).field_0x2c;
  return (int)puVar2;
}

Assistant:

BaseAction *Order::clone() {
    return (new Order(*this));
}